

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcBeamType::~IfcBeamType(IfcBeamType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x9c3ca8;
  *(undefined8 *)&this->field_0x30 = 0x9c3dc0;
  *(undefined8 *)&this[-1].field_0xd0 = 0x9c3cd0;
  *(undefined8 *)&this[-1].field_0xe0 = 0x9c3cf8;
  *(undefined8 *)&this[-1].field_0x138 = 0x9c3d20;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x9c3d48;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x9c3d70;
  *(undefined8 *)this = 0x9c3d98;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x9c4088;
  *(undefined8 *)&this->field_0x30 = 0x9c4150;
  *(undefined8 *)&this[-1].field_0xd0 = 0x9c40b0;
  *(undefined8 *)&this[-1].field_0xe0 = 0x9c40d8;
  *(undefined8 *)&this[-1].field_0x138 = 0x9c4100;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x9c4128;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>.field_0x20)
  {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__009c3de8);
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcBeamType() : Object("IfcBeamType") {}